

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O0

bool __thiscall
pstore::command_line::opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_>::value
          (opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *this,string *v)

{
  bool bVar1;
  uint *puVar2;
  maybe<unsigned_int,_void> local_28;
  maybe<unsigned_int,_void> m;
  string *v_local;
  opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *this_local;
  
  m = (maybe<unsigned_int,_void>)v;
  parser<unsigned_int,_void>::operator()(&local_28,&this->parser_,v);
  bVar1 = maybe::operator_cast_to_bool((maybe *)&local_28);
  if (bVar1) {
    puVar2 = maybe<unsigned_int,_void>::value(&local_28);
    this->value_ = *puVar2;
    this_local._7_1_ = 1;
  }
  maybe<unsigned_int,_void>::~maybe(&local_28);
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool opt<T, Parser>::value (std::string const & v) {
            if (auto m = parser_ (v)) {
                value_ = m.value ();
                return true;
            }
            return false;
        }